

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_copy_to_ucol.h
# Opt level: O1

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::copy_to_ucol
          (SparseLUImpl<double,_int> *this,int jcol,int nseg,IndexVector *segrep,
          BlockIndexVector *repfnz,IndexVector *perm_r,BlockScalarVector *dense,GlobalLU_t *glu)

{
  Index *length;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  char *__function;
  int iVar12;
  int nbElts;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  if (((-1 < jcol) &&
      (lVar10 = (long)jcol,
      lVar10 < (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows)) &&
     (lVar10 < (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows)) {
    nbElts = (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[lVar10];
    if (0 < nseg) {
      iVar1 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[lVar10];
      length = &glu->nzumax;
      uVar16 = (ulong)(uint)nseg;
      iVar11 = 0;
      do {
        if (((long)uVar16 < 1) ||
           ((segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
            (long)uVar16)) goto LAB_0015084c;
        uVar16 = uVar16 - 1;
        uVar2 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_data[uVar16];
        lVar10 = (long)(int)uVar2;
        if ((lVar10 < 0) ||
           ((glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar10)) goto LAB_0015084c;
        iVar12 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[lVar10];
        if (iVar1 != iVar12) {
          if (*(long *)&(repfnz->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8 <= lVar10) {
            __function = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<int, -1, 1>>, Level = 1]"
            ;
            goto LAB_00150861;
          }
          iVar3 = *(int *)(*(long *)&repfnz->
                                     super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          + lVar10 * 4);
          if (iVar3 != -1) {
            if ((iVar12 < 0) ||
               ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= (long)iVar12)) goto LAB_0015084c;
            iVar12 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[iVar12];
            lVar10 = (long)iVar12;
            if ((lVar10 < 0) ||
               ((glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= lVar10)) goto LAB_0015084c;
            iVar12 = (iVar3 - iVar12) +
                     (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[lVar10];
            while (*length < (int)((uVar2 - iVar3) + nbElts + 1)) {
              iVar9 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                                ((SparseLUImpl<double,int> *)this,&glu->ucol,length,nbElts,0,
                                 &glu->num_expansions);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                                ((SparseLUImpl<double,int> *)this,&glu->usub,length,nbElts,1,
                                 &glu->num_expansions);
              if (iVar9 != 0) {
                return iVar9;
              }
            }
            if (-1 < (int)(uVar2 - iVar3)) {
              piVar4 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              pdVar5 = (glu->ucol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              piVar6 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              piVar7 = (glu->usub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              lVar10 = (glu->ucol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              lVar13 = (long)iVar12;
              lVar14 = (long)nbElts;
              iVar9 = 0;
              do {
                if (((((iVar12 < 0) ||
                      ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows <= lVar13)) || (lVar15 = (long)piVar4[lVar13], lVar15 < 0))
                    || (((perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows <= lVar15 || (nbElts < 0)))) ||
                   ((glu->usub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows <= lVar14)) goto LAB_0015084c;
                piVar7[lVar14] = piVar6[lVar15];
                if (*(long *)&(dense->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                              ).field_0x8 <= lVar15) {
                  __function = 
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                  ;
                  goto LAB_00150861;
                }
                if (lVar10 <= lVar14) {
                  __function = 
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                  ;
                  goto LAB_00150861;
                }
                lVar8 = *(long *)&dense->
                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ;
                pdVar5[lVar14] = *(double *)(lVar8 + lVar15 * 8);
                *(undefined8 *)(lVar8 + lVar15 * 8) = 0;
                lVar14 = lVar14 + 1;
                lVar13 = lVar13 + 1;
                iVar9 = iVar9 + -1;
              } while (~uVar2 + iVar3 != iVar9);
              nbElts = nbElts - iVar9;
            }
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != nseg);
    }
    if ((long)(ulong)(jcol + 1) <
        (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [jcol + 1] = nbElts;
      return 0;
    }
  }
LAB_0015084c:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_00150861:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
}

Assistant:

Index SparseLUImpl<Scalar,Index>::copy_to_ucol(const Index jcol, const Index nseg, IndexVector& segrep, BlockIndexVector repfnz ,IndexVector& perm_r, BlockScalarVector dense, GlobalLU_t& glu)
{  
  Index ksub, krep, ksupno; 
    
  Index jsupno = glu.supno(jcol);
  
  // For each nonzero supernode segment of U[*,j] in topological order 
  Index k = nseg - 1, i; 
  Index nextu = glu.xusub(jcol); 
  Index kfnz, isub, segsize; 
  Index new_next,irow; 
  Index fsupc, mem; 
  for (ksub = 0; ksub < nseg; ksub++)
  {
    krep = segrep(k); k--; 
    ksupno = glu.supno(krep); 
    if (jsupno != ksupno ) // should go into ucol(); 
    {
      kfnz = repfnz(krep); 
      if (kfnz != emptyIdxLU)
      { // Nonzero U-segment 
        fsupc = glu.xsup(ksupno); 
        isub = glu.xlsub(fsupc) + kfnz - fsupc; 
        segsize = krep - kfnz + 1; 
        new_next = nextu + segsize; 
        while (new_next > glu.nzumax) 
        {
          mem = memXpand<ScalarVector>(glu.ucol, glu.nzumax, nextu, UCOL, glu.num_expansions); 
          if (mem) return mem; 
          mem = memXpand<IndexVector>(glu.usub, glu.nzumax, nextu, USUB, glu.num_expansions); 
          if (mem) return mem; 
          
        }
        
        for (i = 0; i < segsize; i++)
        {
          irow = glu.lsub(isub); 
          glu.usub(nextu) = perm_r(irow); // Unlike the L part, the U part is stored in its final order
          glu.ucol(nextu) = dense(irow); 
          dense(irow) = Scalar(0.0); 
          nextu++;
          isub++;
        }
        
      } // end nonzero U-segment 
      
    } // end if jsupno 
    
  } // end for each segment
  glu.xusub(jcol + 1) = nextu; // close U(*,jcol)
  return 0; 
}